

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O1

Reals __thiscall Omega_h::normalize_vectors_tmpl<2>(Omega_h *this,Reals *vs)

{
  int *piVar1;
  Alloc *pAVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  Reals RVar8;
  Write<double> out;
  type f;
  Write<double> local_68;
  string local_58;
  Write<double> local_38;
  
  pAVar2 = (vs->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar7 = pAVar2->size;
  }
  else {
    sVar7 = (ulong)pAVar2 >> 3;
  }
  if (((uint)sVar7 >> 3 & 1) == 0) {
    if (((ulong)pAVar2 & 1) == 0) {
      sVar6 = pAVar2->size;
    }
    else {
      sVar6 = (ulong)pAVar2 >> 3;
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    Write<double>::Write(&local_68,(LO)(sVar6 >> 3),&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)local_68.shared_alloc_.alloc;
    if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
        local_68.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58._M_dataplus._M_p = (pointer)((local_68.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_58._M_string_length = (size_type)local_68.shared_alloc_.direct_ptr;
    local_58.field_2._M_allocated_capacity = (size_type)(vs->write_).shared_alloc_.alloc;
    if ((local_58.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_58.field_2._M_allocated_capacity != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58.field_2._M_allocated_capacity =
             ((Alloc *)local_58.field_2._M_allocated_capacity)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_58.field_2._M_allocated_capacity)->use_count =
             ((Alloc *)local_58.field_2._M_allocated_capacity)->use_count + 1;
      }
    }
    local_58.field_2._8_8_ = (vs->write_).shared_alloc_.direct_ptr;
    parallel_for<Omega_h::normalize_vectors_tmpl<2>(Omega_h::Read<double>)::_lambda(int)_1_>
              ((int)(sVar7 >> 3) >> 1,(type *)&local_58,"normalize_vectors");
    local_38.shared_alloc_.alloc = local_68.shared_alloc_.alloc;
    local_38.shared_alloc_.direct_ptr = local_68.shared_alloc_.direct_ptr;
    if ((((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
         local_68.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + -1;
      local_38.shared_alloc_.alloc = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_68.shared_alloc_.alloc = (Alloc *)0x0;
    local_68.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)this,&local_38);
    pAVar2 = local_38.shared_alloc_.alloc;
    pvVar5 = extraout_RDX;
    if (((ulong)local_38.shared_alloc_.alloc & 7) == 0 &&
        local_38.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_38.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_38.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar5 = extraout_RDX_00;
      }
    }
    uVar4 = local_58.field_2._M_allocated_capacity;
    if ((local_58.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_58.field_2._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_58.field_2._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_58.field_2._M_allocated_capacity);
        operator_delete((void *)uVar4,0x48);
        pvVar5 = extraout_RDX_01;
      }
    }
    _Var3._M_p = local_58._M_dataplus._M_p;
    if (((ulong)local_58._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_58._M_dataplus._M_p != (Alloc *)0x0) {
      piVar1 = (int *)(local_58._M_dataplus._M_p + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_58._M_dataplus._M_p);
        operator_delete(_Var3._M_p,0x48);
        pvVar5 = extraout_RDX_02;
      }
    }
    pAVar2 = local_68.shared_alloc_.alloc;
    if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
        local_68.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar5 = extraout_RDX_03;
      }
    }
    RVar8.write_.shared_alloc_.direct_ptr = pvVar5;
    RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar8.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

Reals normalize_vectors_tmpl(Reals vs) {
  auto n = divide_no_remainder(vs.size(), dim);
  auto out = Write<Real>(vs.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_vector<dim>(out, i, normalize(get_vector<dim>(vs, i)));
  };
  parallel_for(n, f, "normalize_vectors");
  return out;
}